

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

bool __thiscall restincurl::Signaler::WasSignalled(Signaler *this)

{
  reference pvVar1;
  ssize_t sVar2;
  undefined1 local_12;
  byte local_11;
  char byte;
  Signaler *pSStack_10;
  bool rval;
  Signaler *this_local;
  
  local_11 = 0;
  local_12 = 0;
  pSStack_10 = this;
  while( true ) {
    pvVar1 = std::array<int,_2UL>::operator[](&this->pipefd_,0);
    sVar2 = read(*pvVar1,&local_12,1);
    if (sVar2 < 1) break;
    local_11 = 1;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool WasSignalled() {
            bool rval = false;
            char byte = {};
            while(read(pipefd_[FD_READ], &byte, 1) > 0) {
                RESTINCURL_LOG_TRACE("Signal: Was signalled");
                rval = true;
            }

            return rval;
        }